

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O3

void __thiscall CSegment::CSegment(CSegment *this)

{
  CObject::CObject(&this->super_CObject);
  (this->super_CObject)._vptr_CObject = (_func_int **)&PTR__CSegment_0018ad00;
  this->m_pPointE = (CPoint *)0x0;
  this->m_pPointS = (CPoint *)0x0;
  return;
}

Assistant:

CSegment::CSegment()
{
	//m_cWidth	=	0;
	m_pPointE	=	NULL;
	m_pPointS	=	NULL;

#ifdef _DEBUG
	m_iNumInstance++;
#endif
}